

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O0

shared_ptr<QPDFObject> __thiscall QPDF_String::create_utf16(QPDF_String *this,string *utf8_val)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar2;
  string local_68;
  undefined1 local_38 [8];
  string result;
  string *utf8_val_local;
  
  result.field_2._8_8_ = utf8_val;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = QUtil::utf8_to_pdf_doc((string *)result.field_2._8_8_,(string *)local_38,'?');
  if (!bVar1) {
    QUtil::utf8_to_utf16(&local_68,(string *)result.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  QPDFObject::create<QPDF_String,std::__cxx11::string&>
            ((QPDFObject *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF_String::create_utf16(std::string const& utf8_val)
{
    std::string result;
    if (!QUtil::utf8_to_pdf_doc(utf8_val, result, '?')) {
        result = QUtil::utf8_to_utf16(utf8_val);
    }
    return QPDFObject::create<QPDF_String>(result);
}